

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall
MPLSParser::parseSubPathEntryExtension(MPLSParser *this,uint8_t *data,uint32_t dataLen)

{
  bool bVar1;
  byte bVar2;
  int local_60;
  char local_5a [2];
  int j;
  uchar numberOfClipEntries;
  bool isMulticlip;
  char clip_Information_file_name [6];
  int i;
  uchar subPlayItems;
  uchar type;
  unsigned_short size;
  undefined1 local_40 [8];
  BitStreamReader reader;
  uint32_t dataLen_local;
  uint8_t *data_local;
  MPLSParser *this_local;
  
  reader.m_bitLeft = dataLen;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_40);
  BitStreamReader::setBuffer((BitStreamReader *)local_40,data,data + reader.m_bitLeft);
  BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
  clip_Information_file_name._4_2_ =
       BitStreamReader::getBits<unsigned_short>((BitStreamReader *)local_40,0x10);
  if (clip_Information_file_name._4_2_ != 0) {
    BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
    BitStreamReader::skipBits((BitStreamReader *)local_40,8);
    clip_Information_file_name[3] =
         BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,8);
    if ((clip_Information_file_name[3] == '\b') || (clip_Information_file_name[3] == '\t')) {
      BitStreamReader::skipBits((BitStreamReader *)local_40,0x18);
      clip_Information_file_name[2] =
           BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,8);
      for (_numberOfClipEntries = 0;
          _numberOfClipEntries < (int)(uint)(byte)clip_Information_file_name[2];
          _numberOfClipEntries = _numberOfClipEntries + 1) {
        BitStreamReader::skipBits((BitStreamReader *)local_40,0x10);
        CLPIStreamInfo::readString(local_5a,(BitStreamReader *)local_40,5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_mvcFiles,(char (*) [6])local_5a);
        BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
        BitStreamReader::skipBits((BitStreamReader *)local_40,0x1f);
        bVar1 = BitStreamReader::getBit((BitStreamReader *)local_40);
        BitStreamReader::skipBits((BitStreamReader *)local_40,8);
        BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
        BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
        BitStreamReader::skipBits((BitStreamReader *)local_40,0x10);
        BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
        if (bVar1) {
          bVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,8);
          BitStreamReader::skipBits((BitStreamReader *)local_40,8);
          for (local_60 = 1; local_60 < (int)(uint)bVar2; local_60 = local_60 + 1) {
            CLPIStreamInfo::readString(local_5a,(BitStreamReader *)local_40,5);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char(&)[6]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->m_mvcFiles,(char (*) [6])local_5a);
            BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
            BitStreamReader::skipBits((BitStreamReader *)local_40,8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void MPLSParser::parseSubPathEntryExtension(uint8_t* data, const uint32_t dataLen)
{
    BitStreamReader reader{};
    reader.setBuffer(data, data + dataLen);
    try
    {
        reader.skipBits(32);  // length
        const auto size = reader.getBits<uint16_t>(16);
        // for (int i = 0; i < size; ++i)
        if (size > 0)
        {
            // subpath extension
            reader.skipBits(32);  // length
            reader.skipBits(8);   // reserved field
            const auto type = reader.getBits<uint8_t>(8);
            if (type == 8 || type == 9)
            {
                reader.skipBits(24);
                const auto subPlayItems = reader.getBits<uint8_t>(8);
                for (int i = 0; i < subPlayItems; ++i)
                {
                    reader.skipBits(16);
                    char clip_Information_file_name[6];
                    CLPIStreamInfo::readString(clip_Information_file_name, reader, 5);
                    m_mvcFiles.emplace_back(clip_Information_file_name);
                    reader.skipBits(32);  // clip codec identifier
                    reader.skipBits(31);  // reserved, condition
                    const bool isMulticlip = reader.getBit();
                    reader.skipBits(8);   // ref to stc id
                    reader.skipBits(32);  // in time
                    reader.skipBits(32);  // out time
                    reader.skipBits(16);  // sync play item id
                    reader.skipBits(32);  // sync start
                    if (isMulticlip)
                    {
                        const auto numberOfClipEntries = reader.getBits<uint8_t>(8);
                        reader.skipBits(8);  // reserved
                        for (int j = 1; j < numberOfClipEntries; ++j)
                        {
                            CLPIStreamInfo::readString(clip_Information_file_name, reader, 5);
                            m_mvcFiles.emplace_back(clip_Information_file_name);
                            reader.skipBits(32);  // clip codec identifier
                            reader.skipBits(8);   // ref to stc id
                        }
                    }
                }
            }
        }
    }
    catch (...)
    {
    }
}